

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O0

void decode_fglrx_ioctl_50(fglrx_ioctl_50 *d,mmt_memory_dump *args,int argc)

{
  int iVar1;
  mmt_buf *local_30;
  mmt_buf *__ret;
  mmt_buf *data1;
  int argc_local;
  mmt_memory_dump *args_local;
  fglrx_ioctl_50 *d_local;
  
  if ((d->kernel_ver_len != 0) || (iVar1 = _fglrx_field_enabled("kernel_ver_len"), iVar1 != 0)) {
    fprintf(_stdout,"%skernel_ver_len: %d",fglrx_pfx,(ulong)d->kernel_ver_len);
  }
  fglrx_pfx = fglrx_sep;
  if (d->_pad04 != 0) {
    fprintf(_stdout,"%s%s_pad04: 0x%08x%s",fglrx_sep,colors->err,(ulong)d->_pad04,colors->reset);
  }
  fglrx_pfx = fglrx_sep;
  local_30 = (mmt_buf *)0x0;
  if ((d->kernel_ver != 0) || (iVar1 = _fglrx_field_enabled("kernel_ver"), iVar1 != 0)) {
    if (d->kernel_ver == 0) {
      fprintf(_stdout,"%skernel_ver: %s",fglrx_pfx,"NULL");
    }
    else {
      fprintf(_stdout,"%skernel_ver: 0x%016lx",fglrx_pfx,d->kernel_ver);
      if (0 < argc) {
        local_30 = find_ptr(d->kernel_ver,args,argc);
      }
      if (local_30 == (mmt_buf *)0x0) {
        fprintf(_stdout,"%s"," [no data]");
      }
    }
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk10 != 0) || (iVar1 = _fglrx_field_enabled("unk10"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk10: 0x%08x",fglrx_pfx,(ulong)d->unk10);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk14 != 0) || (iVar1 = _fglrx_field_enabled("unk14"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk14: 0x%08x",fglrx_pfx,(ulong)d->unk14);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk18 != 0) || (iVar1 = _fglrx_field_enabled("unk18"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk18: 0x%08x",fglrx_pfx,(ulong)d->unk18);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk1c != 0) || (iVar1 = _fglrx_field_enabled("unk1c"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk1c: 0x%08x",fglrx_pfx,(ulong)d->unk1c);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk20 != 0) || (iVar1 = _fglrx_field_enabled("unk20"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk20: 0x%08x",fglrx_pfx,(ulong)d->unk20);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk24 != 0) || (iVar1 = _fglrx_field_enabled("unk24"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk24: 0x%08x",fglrx_pfx,(ulong)d->unk24);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk28 != 0) || (iVar1 = _fglrx_field_enabled("unk28"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk28: 0x%08x",fglrx_pfx,(ulong)d->unk28);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk2c != 0) || (iVar1 = _fglrx_field_enabled("unk2c"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk2c: 0x%08x",fglrx_pfx,(ulong)d->unk2c);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk30 != 0) || (iVar1 = _fglrx_field_enabled("unk30"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk30: 0x%08x",fglrx_pfx,(ulong)d->unk30);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk34 != 0) || (iVar1 = _fglrx_field_enabled("unk34"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk34: 0x%08x",fglrx_pfx,(ulong)d->unk34);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk38 != 0) || (iVar1 = _fglrx_field_enabled("unk38"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk38: 0x%08x",fglrx_pfx,(ulong)d->unk38);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk3c != 0) || (iVar1 = _fglrx_field_enabled("unk3c"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk3c: 0x%08x",fglrx_pfx,(ulong)d->unk3c);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk40 != 0) || (iVar1 = _fglrx_field_enabled("unk40"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk40: 0x%08x",fglrx_pfx,(ulong)d->unk40);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk44 != 0) || (iVar1 = _fglrx_field_enabled("unk44"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk44: 0x%08x",fglrx_pfx,(ulong)d->unk44);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk48 != 0) || (iVar1 = _fglrx_field_enabled("unk48"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk48: 0x%08x",fglrx_pfx,(ulong)d->unk48);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk4c != 0) || (iVar1 = _fglrx_field_enabled("unk4c"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk4c: 0x%08x",fglrx_pfx,(ulong)d->unk4c);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk50 != 0) || (iVar1 = _fglrx_field_enabled("unk50"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk50: 0x%08x",fglrx_pfx,(ulong)d->unk50);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk54 != 0) || (iVar1 = _fglrx_field_enabled("unk54"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk54: 0x%08x",fglrx_pfx,(ulong)d->unk54);
  }
  fglrx_pfx = fglrx_sep;
  fprintf(_stdout,"\n");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (local_30 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(local_30,"kernel_ver");
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_50(struct fglrx_ioctl_50 *d, struct mmt_memory_dump *args, int argc)
{
	fglrx_print_d32(d, kernel_ver_len);
	fglrx_print_pad_x32(d, _pad04);
	struct mmt_buf *data1 = fglrx_print_ptr(d, kernel_ver, args, argc);
	fglrx_print_x32(d, unk10);
	fglrx_print_x32(d, unk14);
	fglrx_print_x32(d, unk18);
	fglrx_print_x32(d, unk1c);
	fglrx_print_x32(d, unk20);
	fglrx_print_x32(d, unk24);
	fglrx_print_x32(d, unk28);
	fglrx_print_x32(d, unk2c);
	fglrx_print_x32(d, unk30);
	fglrx_print_x32(d, unk34);
	fglrx_print_x32(d, unk38);
	fglrx_print_x32(d, unk3c);
	fglrx_print_x32(d, unk40);
	fglrx_print_x32(d, unk44);
	fglrx_print_x32(d, unk48);
	fglrx_print_x32(d, unk4c);
	fglrx_print_x32(d, unk50);
	fglrx_print_x32(d, unk54);
	mmt_log_cont_nl();

	if (data1)
		dump_mmt_buf_as_text(data1, "kernel_ver");
}